

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall node::node(node *this,uint8_t nId)

{
  int local_18;
  int i;
  uint8_t nId_local;
  node *this_local;
  
  this->last = '\x04';
  this->clear_arrows = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->inputCode);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->code);
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::list(&this->labels);
  this->nodeId = nId;
  this->acc = 0;
  this->bak = 0;
  this->pc = '\0';
  this->no_code = false;
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    this->arrows[local_18] = (arrowType *)0x0;
  }
  return;
}

Assistant:

node::node(uint8_t nId){
  nodeId = nId;
  acc = 0;
  bak = 0;
  pc=0;
  no_code=FALSE;
  
  for (int i = 0; i < 4; i++)
  	arrows[i] = NULL;
}